

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-cpu.c
# Opt level: O0

void ggml_set_i32_1d(ggml_tensor *tensor,int i,int32_t value)

{
  long lVar1;
  ggml_bf16_t gVar2;
  ulong uVar3;
  int in_EDX;
  int in_ESI;
  undefined4 *in_RDI;
  undefined8 extraout_XMM0_Qa;
  undefined1 auVar4 [16];
  undefined1 extraout_var [56];
  int64_t id [4];
  undefined1 local_38 [4];
  int32_t in_stack_ffffffffffffffcc;
  int in_stack_ffffffffffffffd0;
  int in_stack_ffffffffffffffd4;
  int in_stack_ffffffffffffffd8;
  int in_stack_ffffffffffffffdc;
  ggml_tensor *in_stack_ffffffffffffffe0;
  undefined1 auVar5 [64];
  
  uVar3 = ggml_is_contiguous(in_RDI);
  auVar5._8_56_ = extraout_var;
  auVar5._0_8_ = extraout_XMM0_Qa;
  if ((uVar3 & 1) == 0) {
    memset(local_38,0,0x20);
    ggml_unravel_index(in_RDI,(long)in_ESI,local_38,&stack0xffffffffffffffd0,
                       &stack0xffffffffffffffd8,&stack0xffffffffffffffe0);
    ggml_set_i32_nd(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8,
                    in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc);
  }
  else {
    switch(*in_RDI) {
    case 0:
      if (*(long *)(in_RDI + 0xc) != 4) {
        ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/ggml/src/ggml-cpu/ggml-cpu.c"
                   ,0x3d1,"GGML_ASSERT(%s) failed","tensor->nb[0] == sizeof(float)");
      }
      *(float *)(*(long *)(in_RDI + 0x3e) + (long)in_ESI * 4) = (float)in_EDX;
      break;
    case 1:
      if (*(long *)(in_RDI + 0xc) != 2) {
        ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/ggml/src/ggml-cpu/ggml-cpu.c"
                   ,0x3c7,"GGML_ASSERT(%s) failed","tensor->nb[0] == sizeof(ggml_fp16_t)");
      }
      auVar4._0_4_ = (float)in_EDX;
      auVar4._4_12_ = auVar5._4_12_;
      auVar4 = vblendps_avx(ZEXT816(0) << 0x40,auVar4,1);
      auVar4 = vcvtps2ph_f16c(auVar4,0);
      *(short *)(*(long *)(in_RDI + 0x3e) + (long)in_ESI * 2) = auVar4._0_2_;
      break;
    default:
      ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/ggml/src/ggml-cpu/ggml-cpu.c"
                 ,0x3d6,"fatal error");
    case 0x18:
      if (*(long *)(in_RDI + 0xc) != 1) {
        ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/ggml/src/ggml-cpu/ggml-cpu.c"
                   ,0x3b8,"GGML_ASSERT(%s) failed","tensor->nb[0] == sizeof(int8_t)");
      }
      *(char *)(*(long *)(in_RDI + 0x3e) + (long)in_ESI) = (char)in_EDX;
      break;
    case 0x19:
      if (*(long *)(in_RDI + 0xc) != 2) {
        ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/ggml/src/ggml-cpu/ggml-cpu.c"
                   ,0x3bd,"GGML_ASSERT(%s) failed","tensor->nb[0] == sizeof(int16_t)");
      }
      *(short *)(*(long *)(in_RDI + 0x3e) + (long)in_ESI * 2) = (short)in_EDX;
      break;
    case 0x1a:
      if (*(long *)(in_RDI + 0xc) != 4) {
        ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/ggml/src/ggml-cpu/ggml-cpu.c"
                   ,0x3c2,"GGML_ASSERT(%s) failed","tensor->nb[0] == sizeof(int32_t)");
      }
      *(int *)(*(long *)(in_RDI + 0x3e) + (long)in_ESI * 4) = in_EDX;
      break;
    case 0x1e:
      if (*(long *)(in_RDI + 0xc) != 2) {
        ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/ggml/src/ggml-cpu/ggml-cpu.c"
                   ,0x3cc,"GGML_ASSERT(%s) failed","tensor->nb[0] == sizeof(ggml_bf16_t)");
      }
      lVar1 = *(long *)(in_RDI + 0x3e);
      gVar2 = ggml_compute_fp32_to_bf16((float)in_EDX);
      *(uint16_t *)(lVar1 + (long)in_ESI * 2) = gVar2.bits;
    }
  }
  return;
}

Assistant:

void ggml_set_i32_1d(const struct ggml_tensor * tensor, int i, int32_t value) {
    if (!ggml_is_contiguous(tensor)) {
        int64_t id[4] = { 0, 0, 0, 0 };
        ggml_unravel_index(tensor, i, &id[0], &id[1], &id[2], &id[3]);
        ggml_set_i32_nd(tensor, id[0], id[1], id[2], id[3], value);
        return;
    }
    switch (tensor->type) {
        case GGML_TYPE_I8:
            {
                GGML_ASSERT(tensor->nb[0] == sizeof(int8_t));
                ((int8_t *)(tensor->data))[i] = value;
            } break;
        case GGML_TYPE_I16:
            {
                GGML_ASSERT(tensor->nb[0] == sizeof(int16_t));
                ((int16_t *)(tensor->data))[i] = value;
            } break;
        case GGML_TYPE_I32:
            {
                GGML_ASSERT(tensor->nb[0] == sizeof(int32_t));
                ((int32_t *)(tensor->data))[i] = value;
            } break;
        case GGML_TYPE_F16:
            {
                GGML_ASSERT(tensor->nb[0] == sizeof(ggml_fp16_t));
                ((ggml_fp16_t *)(tensor->data))[i] = GGML_FP32_TO_FP16(value);
            } break;
        case GGML_TYPE_BF16:
            {
                GGML_ASSERT(tensor->nb[0] == sizeof(ggml_bf16_t));
                ((ggml_bf16_t *)(tensor->data))[i] = GGML_FP32_TO_BF16(value);
            } break;
        case GGML_TYPE_F32:
            {
                GGML_ASSERT(tensor->nb[0] == sizeof(float));
                ((float *)(tensor->data))[i] = value;
            } break;
        default:
            {
                GGML_ABORT("fatal error");
            }
    }
}